

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_variables.c
# Opt level: O0

ngx_stream_regex_t * ngx_stream_regex_compile(ngx_conf_t *cf,ngx_regex_compile_t *rc)

{
  long lVar1;
  ngx_int_t nVar2;
  ngx_pool_t *pnVar3;
  ngx_cycle_t *pnVar4;
  ngx_stream_variable_t *pnVar5;
  ngx_pool_t *pnVar6;
  ngx_array_t *local_78;
  ngx_stream_core_main_conf_t *cmcf;
  ngx_stream_regex_variable_t *rv;
  ngx_stream_regex_t *re;
  ngx_stream_variable_t *v;
  ngx_uint_t n;
  ngx_uint_t i;
  ngx_str_t name;
  size_t size;
  u_char *p;
  ngx_regex_compile_t *rc_local;
  ngx_conf_t *cf_local;
  
  rc->pool = cf->pool;
  nVar2 = ngx_regex_compile(rc);
  if (nVar2 == 0) {
    cf_local = (ngx_conf_t *)ngx_pcalloc(cf->pool,0x30);
    if (cf_local == (ngx_conf_t *)0x0) {
      cf_local = (ngx_conf_t *)0x0;
    }
    else {
      cf_local->name = (char *)rc->regex;
      cf_local->args = (ngx_array_t *)(long)rc->captures;
      cf_local->temp_pool = (ngx_pool_t *)(rc->pattern).len;
      cf_local->conf_file = (ngx_conf_file_t *)(rc->pattern).data;
      lVar1 = *(long *)(*cf->ctx + ngx_stream_core_module.ctx_index * 8);
      if (*(ngx_array_t **)(lVar1 + 0xb8) < cf_local->args) {
        local_78 = cf_local->args;
      }
      else {
        local_78 = *(ngx_array_t **)(lVar1 + 0xb8);
      }
      *(ngx_array_t **)(lVar1 + 0xb8) = local_78;
      pnVar3 = (ngx_pool_t *)(long)rc->named_captures;
      if (pnVar3 != (ngx_pool_t *)0x0) {
        pnVar4 = (ngx_cycle_t *)ngx_palloc(rc->pool,(long)pnVar3 << 4);
        if (pnVar4 == (ngx_cycle_t *)0x0) {
          cf_local = (ngx_conf_t *)0x0;
        }
        else {
          cf_local->cycle = pnVar4;
          cf_local->pool = pnVar3;
          name.data = (u_char *)(long)rc->name_size;
          size = (size_t)rc->names;
          for (n = 0; n < pnVar3; n = n + 1) {
            (&pnVar4->conf_ctx)[n * 2] =
                 (void ****)
                 (long)(int)(((uint)*(byte *)size * 0x100 + (uint)*(byte *)(size + 1)) * 2);
            name.len = size + 2;
            i = strlen((char *)name.len);
            pnVar5 = ngx_stream_add_variable(cf,(ngx_str_t *)&i,1);
            if (pnVar5 == (ngx_stream_variable_t *)0x0) {
              return (ngx_stream_regex_t *)0x0;
            }
            pnVar6 = (ngx_pool_t *)ngx_stream_get_variable_index(cf,(ngx_str_t *)&i);
            (&pnVar4->pool)[n * 2] = pnVar6;
            if ((&pnVar4->pool)[n * 2] == (ngx_pool_t *)0xffffffffffffffff) {
              return (ngx_stream_regex_t *)0x0;
            }
            pnVar5->get_handler = ngx_stream_variable_not_found;
            size = (size_t)(name.data + size);
          }
        }
      }
    }
  }
  else {
    ngx_conf_log_error(1,cf,0,"%V",&rc->err);
    cf_local = (ngx_conf_t *)0x0;
  }
  return (ngx_stream_regex_t *)cf_local;
}

Assistant:

ngx_stream_regex_t *
ngx_stream_regex_compile(ngx_conf_t *cf, ngx_regex_compile_t *rc)
{
    u_char                       *p;
    size_t                        size;
    ngx_str_t                     name;
    ngx_uint_t                    i, n;
    ngx_stream_variable_t        *v;
    ngx_stream_regex_t           *re;
    ngx_stream_regex_variable_t  *rv;
    ngx_stream_core_main_conf_t  *cmcf;

    rc->pool = cf->pool;

    if (ngx_regex_compile(rc) != NGX_OK) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0, "%V", &rc->err);
        return NULL;
    }

    re = ngx_pcalloc(cf->pool, sizeof(ngx_stream_regex_t));
    if (re == NULL) {
        return NULL;
    }

    re->regex = rc->regex;
    re->ncaptures = rc->captures;
    re->name = rc->pattern;

    cmcf = ngx_stream_conf_get_module_main_conf(cf, ngx_stream_core_module);
    cmcf->ncaptures = ngx_max(cmcf->ncaptures, re->ncaptures);

    n = (ngx_uint_t) rc->named_captures;

    if (n == 0) {
        return re;
    }

    rv = ngx_palloc(rc->pool, n * sizeof(ngx_stream_regex_variable_t));
    if (rv == NULL) {
        return NULL;
    }

    re->variables = rv;
    re->nvariables = n;

    size = rc->name_size;
    p = rc->names;

    for (i = 0; i < n; i++) {
        rv[i].capture = 2 * ((p[0] << 8) + p[1]);

        name.data = &p[2];
        name.len = ngx_strlen(name.data);

        v = ngx_stream_add_variable(cf, &name, NGX_STREAM_VAR_CHANGEABLE);
        if (v == NULL) {
            return NULL;
        }

        rv[i].index = ngx_stream_get_variable_index(cf, &name);
        if (rv[i].index == NGX_ERROR) {
            return NULL;
        }

        v->get_handler = ngx_stream_variable_not_found;

        p += size;
    }

    return re;
}